

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

SourceLocation __thiscall
slang::SourceManager::getFullyOriginalLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  variant_alternative_t<1UL,_variant<FileInfo,_ExpansionInfo>_> *pvVar2;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  if ((((ulong)location & 0xfffffff) != 0) && ((location._0_4_ & 0xfffffff) != 0xfffffff)) {
    while ((pvVar1 = (this->bufferEntries).
                     super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, pvVar1 != (pointer)0x0 &&
           (*(__index_type *)
             ((long)&pvVar1[location._0_4_ & 0xfffffff].
                     super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                     .
                     super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                     .
                     super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
             + 0x38) == '\x01'))) {
      if (((ulong)location & 0xfffffff) == 0) {
        location = (SourceLocation)0x0;
      }
      else {
        pvVar2 = std::get<1ul,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                           ((this->bufferEntries).
                            super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            ((ulong)location & 0xfffffff));
        location = (SourceLocation)
                   (((ulong)location & 0xfffffffff0000000) + (long)pvVar2->originalLoc);
      }
      if ((((ulong)location & 0xfffffff) == 0) || ((location._0_4_ & 0xfffffff) == 0xfffffff))
      break;
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return location;
}

Assistant:

SourceLocation SourceManager::getFullyOriginalLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    while (isMacroLocImpl(location, lock))
        location = getOriginalLocImpl(location, lock);
    return location;
}